

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcomp.c
# Opt level: O1

int av1_obmc_full_pixel_search
              (FULLPEL_MV start_mv,FULLPEL_MOTION_SEARCH_PARAMS *ms_params,int step_param,
              FULLPEL_MV *best_mv)

{
  byte bVar1;
  MV_COST_TYPE MVar2;
  ushort uVar3;
  buf_2d *pbVar4;
  short sVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  int iVar11;
  MV *pMVar12;
  aom_variance_fn_ptr_t *paVar13;
  short sVar14;
  short sVar15;
  short sVar16;
  short sVar17;
  short sVar18;
  int best_site;
  ulong uVar19;
  int iVar20;
  uint uVar21;
  int j;
  ulong uVar22;
  undefined1 auVar23 [16];
  short sVar24;
  short sVar26;
  FULLPEL_MV FVar25;
  FULLPEL_MV tmp_mv;
  FULLPEL_MV local_7c;
  int local_78;
  uint local_74;
  buf_2d *local_70;
  aom_variance_fn_ptr_t *local_68;
  int local_5c;
  undefined1 local_58 [16];
  ulong local_48;
  int32_t *local_40;
  int32_t *local_38;
  
  if (ms_params->fast_obmc_search == 0) {
    local_58._0_8_ = ms_params->search_sites;
    local_78 = 0;
    iVar9 = obmc_diamond_search_sad(ms_params,start_mv,&local_7c,step_param,&local_5c);
    paVar13 = (aom_variance_fn_ptr_t *)0x7fffffff;
    if (iVar9 != 0x7fffffff) {
      pbVar4 = (ms_params->ms_buffers).ref;
      iVar7 = (int)local_7c.row;
      iVar6 = (int)local_7c.col;
      iVar9 = pbVar4->stride;
      uVar21 = (*ms_params->vfp->ovf)
                         (pbVar4->buf + (iVar9 * iVar7 + iVar6),iVar9,(ms_params->ms_buffers).wsrc,
                          (ms_params->ms_buffers).obmc_mask,&local_74);
      MVar2 = (ms_params->mv_cost_params).mv_cost_type;
      iVar9 = 0;
      if (MVar2 != '\x04') {
        iVar7 = iVar7 * 8;
        pMVar12 = (ms_params->mv_cost_params).ref_mv;
        uVar3 = pMVar12->row;
        sVar24 = pMVar12->col;
        sVar5 = (short)(iVar6 << 3);
        sVar16 = sVar5 - sVar24;
        sVar14 = (short)(iVar7 - (uint)uVar3);
        sVar26 = -sVar14;
        if (0 < sVar14) {
          sVar26 = sVar14;
        }
        sVar15 = -sVar16;
        if (0 < sVar16) {
          sVar15 = sVar16;
        }
        if (MVar2 == '\x03') {
          iVar9 = (int)sVar15 + (int)sVar26 >> 3;
        }
        else if (MVar2 == '\x01') {
          iVar9 = (int)sVar15 + (int)sVar26 >> 2;
        }
        else if (MVar2 == '\0') {
          iVar9 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar16] +
                         (long)(ms_params->mv_cost_params).mvcost[0][sVar14] +
                        (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                      (ulong)((uint)(sVar5 != sVar24) * 4 +
                                             (uint)((ushort)iVar7 != uVar3) * 8))) *
                        (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
        }
      }
      paVar13 = (aom_variance_fn_ptr_t *)(ulong)(iVar9 + uVar21);
    }
    *best_mv = local_7c;
    iVar9 = ~step_param + *(int *)(local_58._0_8_ + 0xbb0);
    if (local_5c < iVar9) {
      uVar19 = CONCAT44(0,step_param + 1);
      local_70 = (buf_2d *)CONCAT44(local_70._4_4_,start_mv);
      local_58._0_8_ = uVar19;
      iVar6 = local_5c;
      do {
        if (local_78 == 0) {
          iVar7 = obmc_diamond_search_sad
                            (ms_params,start_mv,&local_7c,(int)uVar19 + iVar6,&local_78);
          uVar21 = 0x7fffffff;
          if (iVar7 != 0x7fffffff) {
            pbVar4 = (ms_params->ms_buffers).ref;
            iVar11 = (int)local_7c.row;
            iVar20 = (int)local_7c.col;
            iVar7 = pbVar4->stride;
            local_68 = paVar13;
            uVar21 = (*ms_params->vfp->ovf)
                               (pbVar4->buf + (iVar7 * iVar11 + iVar20),iVar7,
                                (ms_params->ms_buffers).wsrc,(ms_params->ms_buffers).obmc_mask,
                                &local_74);
            MVar2 = (ms_params->mv_cost_params).mv_cost_type;
            iVar7 = 0;
            if (MVar2 != '\x04') {
              pMVar12 = (ms_params->mv_cost_params).ref_mv;
              sVar24 = pMVar12->row;
              sVar5 = (short)(iVar11 << 3);
              sVar15 = sVar5 - sVar24;
              sVar26 = pMVar12->col;
              sVar14 = (short)(iVar20 << 3);
              sVar17 = sVar14 - sVar26;
              sVar16 = -sVar15;
              if (0 < sVar15) {
                sVar16 = sVar15;
              }
              sVar18 = -sVar17;
              if (0 < sVar17) {
                sVar18 = sVar17;
              }
              if (MVar2 == '\x03') {
                iVar7 = (int)sVar18 + (int)sVar16 >> 3;
              }
              else if (MVar2 == '\x01') {
                iVar7 = (int)sVar18 + (int)sVar16 >> 2;
              }
              else if (MVar2 == '\0') {
                iVar7 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar17] +
                               (long)(ms_params->mv_cost_params).mvcost[0][sVar15] +
                              (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                            (ulong)((uint)(sVar14 != sVar26) * 4 +
                                                   (uint)(sVar5 != sVar24) * 8))) *
                              (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
              }
            }
            uVar21 = iVar7 + uVar21;
            paVar13 = local_68;
            start_mv = local_70._0_4_;
          }
          uVar19 = local_58._0_8_;
          if ((int)uVar21 < (int)paVar13) {
            *best_mv = local_7c;
            paVar13 = (aom_variance_fn_ptr_t *)(ulong)uVar21;
          }
        }
        else {
          local_78 = local_78 + -1;
        }
        iVar6 = iVar6 + 1;
      } while (iVar6 < iVar9);
    }
  }
  else {
    *best_mv = start_mv;
    iVar6 = (int)best_mv->col;
    iVar9 = (ms_params->mv_limits).col_max;
    if (iVar6 < iVar9) {
      iVar9 = iVar6;
    }
    iVar7 = (ms_params->mv_limits).col_min;
    sVar24 = (short)iVar9;
    if (iVar6 < iVar7) {
      sVar24 = (short)iVar7;
    }
    best_mv->col = sVar24;
    iVar7 = (int)start_mv.row;
    iVar9 = (ms_params->mv_limits).row_min;
    iVar6 = (ms_params->mv_limits).row_max;
    if (iVar7 < iVar6) {
      iVar6 = iVar7;
    }
    sVar26 = (short)iVar6;
    if (iVar7 < iVar9) {
      sVar26 = (short)iVar9;
    }
    best_mv->row = sVar26;
    local_68 = ms_params->vfp;
    local_70 = (ms_params->ms_buffers).ref;
    local_38 = (ms_params->ms_buffers).wsrc;
    local_40 = (ms_params->ms_buffers).obmc_mask;
    uVar8 = (*local_68->osdf)(local_70->buf + ((int)sVar24 + (int)sVar26 * local_70->stride),
                              local_70->stride,local_38,local_40);
    bVar1 = (ms_params->mv_cost_params).mv_cost_type;
    local_48 = 0;
    uVar21 = 0;
    if (bVar1 < 4) {
      FVar25 = (ms_params->mv_cost_params).full_ref_mv;
      auVar23 = psllw(ZEXT416(CONCAT22((*best_mv).col - FVar25.col,(*best_mv).row - FVar25.row)),3);
      sVar24 = auVar23._0_2_;
      sVar26 = auVar23._2_2_;
      switch(bVar1) {
      case 0:
        uVar21 = ((ms_params->mv_cost_params).mvcost[0][sVar24] +
                  *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                          (ulong)((uint)(sVar26 != 0) * 4 + (uint)(sVar24 != 0) * 8)) +
                 (ms_params->mv_cost_params).mvcost[1][sVar26]) *
                 (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
        break;
      case 1:
        sVar5 = -sVar24;
        sVar14 = -sVar26;
        uVar21 = ((uint)(ushort)((ushort)(sVar14 < sVar26) * sVar26 |
                                (ushort)(sVar14 >= sVar26) * sVar14) +
                 (uint)(ushort)((ushort)(sVar5 < sVar24) * sVar24 |
                               (ushort)(sVar5 >= sVar24) * sVar5)) * 4;
        break;
      case 2:
        sVar5 = -sVar24;
        sVar14 = -sVar26;
        uVar21 = ((uint)(ushort)((ushort)(sVar14 < sVar26) * sVar26 |
                                (ushort)(sVar14 >= sVar26) * sVar14) +
                 (uint)(ushort)((ushort)(sVar5 < sVar24) * sVar24 |
                               (ushort)(sVar5 >= sVar24) * sVar5)) * 0xf >> 3;
        break;
      case 3:
        sVar5 = -sVar24;
        sVar14 = -sVar26;
        uVar21 = (uint)(ushort)((ushort)(sVar14 < sVar26) * sVar26 |
                               (ushort)(sVar14 >= sVar26) * sVar14) +
                 (uint)(ushort)((ushort)(sVar5 < sVar24) * sVar24 |
                               (ushort)(sVar5 >= sVar24) * sVar5);
      }
    }
    uVar21 = uVar21 + uVar8;
    do {
      pMVar12 = av1_int_pro_motion_estimation::search_pos;
      uVar19 = 0xffffffff;
      uVar22 = 0;
      do {
        sVar24 = (*pMVar12).row + (*best_mv).row;
        sVar26 = (*pMVar12).col + (*best_mv).col;
        iVar9 = (int)sVar26;
        if (((((ms_params->mv_limits).col_min <= iVar9) && (iVar9 <= (ms_params->mv_limits).col_max)
             ) && (iVar6 = (int)sVar24, (ms_params->mv_limits).row_min <= iVar6)) &&
           ((iVar6 <= (ms_params->mv_limits).row_max &&
            (local_58 = ZEXT416(CONCAT22(sVar26,sVar24)),
            uVar8 = (*local_68->osdf)(local_70->buf + (iVar6 * local_70->stride + iVar9),
                                      local_70->stride,local_38,local_40), uVar8 < uVar21)))) {
          bVar1 = (ms_params->mv_cost_params).mv_cost_type;
          if (bVar1 < 4) {
            FVar25 = (ms_params->mv_cost_params).full_ref_mv;
            auVar23._0_2_ = local_58._0_2_ - FVar25.row;
            auVar23._2_2_ = local_58._2_2_ - FVar25.col;
            auVar23._4_2_ = local_58._4_2_;
            auVar23._6_2_ = local_58._6_2_;
            auVar23._8_2_ = local_58._8_2_;
            auVar23._10_2_ = local_58._10_2_;
            auVar23._12_2_ = local_58._12_2_;
            auVar23._14_2_ = local_58._14_2_;
            auVar23 = psllw(auVar23,3);
            sVar24 = auVar23._0_2_;
            sVar26 = auVar23._2_2_;
            switch(bVar1) {
            case 0:
              uVar10 = ((ms_params->mv_cost_params).mvcost[0][sVar24] +
                        *(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                (ulong)((uint)(sVar26 != 0) * 4 + (uint)(sVar24 != 0) * 8)) +
                       (ms_params->mv_cost_params).mvcost[1][sVar26]) *
                       (ms_params->mv_cost_params).sad_per_bit + 0x100U >> 9;
              break;
            case 1:
              sVar5 = -sVar24;
              sVar14 = -sVar26;
              uVar10 = ((uint)(ushort)((ushort)(sVar14 < sVar26) * sVar26 |
                                      (ushort)(sVar14 >= sVar26) * sVar14) +
                       (uint)(ushort)((ushort)(sVar5 < sVar24) * sVar24 |
                                     (ushort)(sVar5 >= sVar24) * sVar5)) * 4;
              break;
            case 2:
              sVar5 = -sVar24;
              sVar14 = -sVar26;
              uVar10 = ((uint)(ushort)((ushort)(sVar14 < sVar26) * sVar26 |
                                      (ushort)(sVar14 >= sVar26) * sVar14) +
                       (uint)(ushort)((ushort)(sVar5 < sVar24) * sVar24 |
                                     (ushort)(sVar5 >= sVar24) * sVar5)) * 0xf >> 3;
              break;
            case 3:
              sVar5 = -sVar24;
              sVar14 = -sVar26;
              uVar10 = (uint)(ushort)((ushort)(sVar14 < sVar26) * sVar26 |
                                     (ushort)(sVar14 >= sVar26) * sVar14) +
                       (uint)(ushort)((ushort)(sVar5 < sVar24) * sVar24 |
                                     (ushort)(sVar5 >= sVar24) * sVar5);
            }
          }
          else {
            uVar10 = 0;
          }
          if (uVar10 + uVar8 < uVar21) {
            uVar19 = uVar22 & 0xffffffff;
            uVar21 = uVar10 + uVar8;
          }
        }
        uVar22 = uVar22 + 1;
        pMVar12 = pMVar12 + 1;
      } while (uVar22 != 4);
      if ((int)uVar19 == -1) break;
      FVar25.row = (*best_mv).row + av1_int_pro_motion_estimation::search_pos[(int)uVar19].row;
      FVar25.col = (*best_mv).col + av1_int_pro_motion_estimation::search_pos[(int)uVar19].col;
      *best_mv = FVar25;
      uVar8 = (int)local_48 + 1;
      local_48 = (ulong)uVar8;
    } while (uVar8 != 8);
    paVar13 = (aom_variance_fn_ptr_t *)0x7fffffff;
    if (uVar21 != 0x7fffffff) {
      pbVar4 = (ms_params->ms_buffers).ref;
      sVar24 = best_mv->row;
      sVar26 = best_mv->col;
      iVar9 = pbVar4->stride;
      uVar21 = (*ms_params->vfp->ovf)
                         (pbVar4->buf + (iVar9 * sVar24 + (int)sVar26),iVar9,
                          (ms_params->ms_buffers).wsrc,(ms_params->ms_buffers).obmc_mask,&local_74);
      MVar2 = (ms_params->mv_cost_params).mv_cost_type;
      iVar9 = 0;
      if (MVar2 != '\x04') {
        iVar6 = sVar24 * 8;
        pMVar12 = (ms_params->mv_cost_params).ref_mv;
        uVar3 = pMVar12->row;
        sVar24 = pMVar12->col;
        sVar5 = (short)((int)sVar26 << 3);
        sVar16 = sVar5 - sVar24;
        sVar14 = (short)(iVar6 - (uint)uVar3);
        sVar26 = -sVar14;
        if (0 < sVar14) {
          sVar26 = sVar14;
        }
        sVar15 = -sVar16;
        if (0 < sVar16) {
          sVar15 = sVar16;
        }
        if (MVar2 == '\x03') {
          iVar9 = (int)sVar15 + (int)sVar26 >> 3;
        }
        else if (MVar2 == '\x01') {
          iVar9 = (int)sVar15 + (int)sVar26 >> 2;
        }
        else if (MVar2 == '\0') {
          iVar9 = (int)(((long)(ms_params->mv_cost_params).mvcost[1][sVar16] +
                         (long)(ms_params->mv_cost_params).mvcost[0][sVar14] +
                        (long)*(int *)((long)(ms_params->mv_cost_params).mvjcost +
                                      (ulong)((uint)(sVar5 != sVar24) * 4 +
                                             (uint)((ushort)iVar6 != uVar3) * 8))) *
                        (long)(ms_params->mv_cost_params).error_per_bit + 0x2000U >> 0xe);
        }
      }
      paVar13 = (aom_variance_fn_ptr_t *)(ulong)(iVar9 + uVar21);
    }
  }
  return (int)paVar13;
}

Assistant:

int av1_obmc_full_pixel_search(const FULLPEL_MV start_mv,
                               const FULLPEL_MOTION_SEARCH_PARAMS *ms_params,
                               const int step_param, FULLPEL_MV *best_mv) {
  if (!ms_params->fast_obmc_search) {
    const int bestsme =
        obmc_full_pixel_diamond(ms_params, start_mv, step_param, best_mv);
    return bestsme;
  } else {
    *best_mv = start_mv;
    clamp_fullmv(best_mv, &ms_params->mv_limits);
    int thissme = obmc_refining_search_sad(ms_params, best_mv);
    if (thissme < INT_MAX) thissme = get_obmc_mvpred_var(ms_params, best_mv);
    return thissme;
  }
}